

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml-backend-reg.cpp
# Opt level: O2

ggml_backend_dev_t ggml_backend_dev_by_type(ggml_backend_dev_type type)

{
  ggml_backend_dev_type gVar1;
  size_t sVar2;
  ggml_backend_dev_t pgVar3;
  size_t i;
  ulong index;
  
  index = 0;
  do {
    sVar2 = ggml_backend_dev_count();
    if (sVar2 <= index) {
      return (ggml_backend_dev_t)0x0;
    }
    pgVar3 = ggml_backend_dev_get(index);
    gVar1 = ggml_backend_dev_type(pgVar3);
    index = index + 1;
  } while (gVar1 != type);
  return pgVar3;
}

Assistant:

ggml_backend_dev_t ggml_backend_dev_by_type(enum ggml_backend_dev_type type) {
    for (size_t i = 0; i < ggml_backend_dev_count(); i++) {
        ggml_backend_dev_t dev = ggml_backend_dev_get(i);
        if (ggml_backend_dev_type(dev) == type) {
            return dev;
        }
    }
    return nullptr;
}